

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_prepro.cpp
# Opt level: O3

DFsSection * __thiscall DFsScript::FindSectionStart(DFsScript *this,char *brace)

{
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar1;
  long lVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1 aVar3;
  
  lVar2 = (long)(((int)brace - *(int *)&this->data) % 0x11);
  aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)this->sections[lVar2].field_0.p;
  if (aVar1.p != (DFsSection *)0x0) {
    if ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) == 0) {
      do {
        aVar3 = aVar1;
        if (this->data + (aVar3.p)->start_index == brace) {
          return aVar3.p;
        }
        aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DFsSection>_1)((aVar3.p)->next).field_0.p;
        if (aVar1.p == (DFsSection *)0x0) {
          return (DFsSection *)0x0;
        }
      } while ((((aVar1.p)->super_DObject).ObjectFlags & 0x20) == 0);
    }
    else {
      aVar3.p = (DFsSection *)(this->sections + lVar2 + -7);
    }
    ((aVar3.p)->next).field_0.p = (DFsSection *)0x0;
  }
  return (DFsSection *)0x0;
}

Assistant:

DFsSection *DFsScript::FindSectionStart(const char *brace)
{
	int n = section_hash(brace);
	DFsSection *current = sections[n];
	
	// use the hash table: check the appropriate hash chain
	
	while(current)
    {
		if(SectionStart(current) == brace) return current;
		current = current->next;
    }
	
	return NULL;    // not found
}